

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O2

void __thiscall t_generator::generate_program(t_generator *this)

{
  int iVar1;
  long lVar2;
  pointer pptVar3;
  pointer pptVar4;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  _Vector_base<t_struct_*,_std::allocator<t_struct_*>_> local_d0;
  _Vector_base<t_service_*,_std::allocator<t_service_*>_> local_b8;
  _Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_> local_a0;
  _Vector_base<t_const_*,_std::allocator<t_const_*>_> local_88;
  _Vector_base<t_const_*,_std::allocator<t_const_*>_> local_70;
  _Vector_base<t_enum_*,_std::allocator<t_enum_*>_> local_58;
  string local_40 [32];
  
  (*this->_vptr_t_generator[0xf])();
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&local_58,&this->program_->enums_);
  for (; local_58._M_impl.super__Vector_impl_data._M_start !=
         local_58._M_impl.super__Vector_impl_data._M_finish;
      local_58._M_impl.super__Vector_impl_data._M_start =
           local_58._M_impl.super__Vector_impl_data._M_start + 1) {
    (*this->_vptr_t_generator[0x13])(this,*local_58._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_a0,
             &this->program_->typedefs_);
  for (; local_a0._M_impl.super__Vector_impl_data._M_start !=
         local_a0._M_impl.super__Vector_impl_data._M_finish;
      local_a0._M_impl.super__Vector_impl_data._M_start =
           local_a0._M_impl.super__Vector_impl_data._M_start + 1) {
    (*this->_vptr_t_generator[0x12])(this,*local_a0._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&local_d0,&this->program_->objects_)
  ;
  for (pptVar3 = local_d0._M_impl.super__Vector_impl_data._M_start;
      pptVar4 = local_d0._M_impl.super__Vector_impl_data._M_start,
      pptVar3 != local_d0._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    (*this->_vptr_t_generator[0x17])(this,*pptVar3);
  }
  for (; pptVar4 != pptVar3; pptVar4 = pptVar4 + 1) {
    iVar1 = (*((*pptVar4)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
    lVar2 = 0xa8;
    if ((char)iVar1 != '\0') {
      lVar2 = 0xc0;
    }
    (**(code **)((long)this->_vptr_t_generator + lVar2))(this,*pptVar4);
    pptVar3 = local_d0._M_impl.super__Vector_impl_data._M_finish;
  }
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)&local_70,&this->program_->consts_);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)&local_88,
             (vector<t_const_*,_std::allocator<t_const_*>_> *)&local_70);
  (*this->_vptr_t_generator[0x11])(this,&local_88);
  std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base(&local_88);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&local_b8,
             &this->program_->services_);
  for (; local_b8._M_impl.super__Vector_impl_data._M_start !=
         local_b8._M_impl.super__Vector_impl_data._M_finish;
      local_b8._M_impl.super__Vector_impl_data._M_start =
           local_b8._M_impl.super__Vector_impl_data._M_start + 1) {
    (*this->_vptr_t_generator[0x1a])
              (local_40,this,*local_b8._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::operator=((string *)&this->service_name_,local_40);
    std::__cxx11::string::~string(local_40);
    (*this->_vptr_t_generator[0x16])(this,*local_b8._M_impl.super__Vector_impl_data._M_start);
  }
  (*this->_vptr_t_generator[0x10])(this);
  std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base(&local_b8);
  std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base(&local_70);
  std::_Vector_base<t_struct_*,_std::allocator<t_struct_*>_>::~_Vector_base(&local_d0);
  std::_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>::~_Vector_base(&local_a0);
  std::_Vector_base<t_enum_*,_std::allocator<t_enum_*>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void t_generator::generate_program() {
  // Initialize the generator
  init_generator();

  // Generate enums
  vector<t_enum*> enums = program_->get_enums();
  vector<t_enum*>::iterator en_iter;
  for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
    generate_enum(*en_iter);
  }

  // Generate typedefs
  vector<t_typedef*> typedefs = program_->get_typedefs();
  vector<t_typedef*>::iterator td_iter;
  for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
    generate_typedef(*td_iter);
  }

  // Generate structs, exceptions, and unions in declared order
  vector<t_struct*> objects = program_->get_objects();

  vector<t_struct*>::iterator o_iter;
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    generate_forward_declaration(*o_iter);
  }
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    if ((*o_iter)->is_xception()) {
      generate_xception(*o_iter);
    } else {
      generate_struct(*o_iter);
    }
  }

  // Generate constants
  vector<t_const*> consts = program_->get_consts();
  generate_consts(consts);

  // Generate services
  vector<t_service*> services = program_->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    service_name_ = get_service_name(*sv_iter);
    generate_service(*sv_iter);
  }

  // Close the generator
  close_generator();
}